

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int iVar3;
  TestPartResult *pTVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  TimeInMillis ms;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *result;
  long lVar8;
  int iVar9;
  int i;
  pointer pcVar10;
  char *pcVar11;
  internal *this;
  string location;
  string summary;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string kTestcase;
  string local_f0;
  ostream *local_d0;
  TestInfo *local_c8;
  string local_c0;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  TestResult *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_c8 = test_info;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"testcase","");
  local_d0 = stream;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
  std::__cxx11::string::string
            ((string *)&local_c0,(local_c8->name_)._M_dataplus._M_p,(allocator *)&local_98);
  OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pbVar2 = (local_c8->value_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"value_param","");
    pbVar2 = (local_c8->value_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_c0,pcVar10,(allocator *)&local_98);
    OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  pbVar2 = (local_c8->type_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"type_param","");
    pbVar2 = (local_c8->type_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (pbVar2->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_c0,pcVar10,(allocator *)&local_98);
    OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"status","");
  pcVar11 = "notrun";
  if ((ulong)local_c8->should_run_ != 0) {
    pcVar11 = "run";
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,pcVar11,pcVar11 + ((ulong)local_c8->should_run_ ^ 1) * 3 + 3);
  OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_c0,(internal *)(local_c8->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"classname","");
  std::__cxx11::string::string((string *)&local_c0,test_case_name,(allocator *)&local_98);
  OutputXmlAttribute(local_d0,&local_58,&local_f0,&local_c0);
  result = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
    result = extraout_RDX_00;
  }
  local_38 = &local_c8->result_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
    result = extraout_RDX_01;
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_(&local_f0,(XmlUnitTestResultPrinter *)local_38,result);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_d0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (0 < (int)((ulong)((long)(local_c8->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_c8->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    paVar1 = &local_98.field_2;
    i = 0;
    iVar9 = 0;
    do {
      iVar3 = (int)local_c8;
      pTVar4 = TestResult::GetTestPartResult(local_38,i);
      if (pTVar4->type_ != kSuccess) {
        if (iVar9 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_d0,">\n",2);
        }
        this = (internal *)(pTVar4->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar4->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_f0,this,(char *)(ulong)(uint)pTVar4->line_number_,iVar3);
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        std::__cxx11::string::append((char *)&local_98);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c0.field_2._M_allocated_capacity = *psVar7;
          local_c0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar7;
          local_c0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_c0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_d0,"      <failure message=\"",0x18);
        std::__cxx11::string::string((string *)&local_78,local_c0._M_dataplus._M_p,&local_99);
        EscapeXml(&local_98,&local_78,true);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_d0,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" type=\"\">",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_f0._M_dataplus._M_p,
                   local_f0._M_dataplus._M_p + local_f0._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_98.field_2._M_allocated_capacity = *psVar7;
          local_98.field_2._8_8_ = plVar5[3];
          local_98._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar7;
          local_98._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_98._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        RemoveInvalidXmlCharacters(&local_78,&local_98);
        OutputXmlCDataSection(local_d0,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_d0,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        iVar9 = iVar9 + 1;
      }
      i = i + 1;
      iVar3 = (int)((ulong)((long)(local_c8->result_).test_part_results_.
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_c8->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar3 * -0x49249249) != i + iVar3 * 0x49249249 < 0);
    if (iVar9 != 0) {
      lVar8 = 0x10;
      pcVar11 = "    </testcase>\n";
      goto LAB_0012ef56;
    }
  }
  lVar8 = 4;
  pcVar11 = " />\n";
LAB_0012ef56:
  std::__ostream_insert<char,std::char_traits<char>>(local_d0,pcVar11,lVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}